

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_resample.c
# Opt level: O0

t_int * upsampling_perform_hold(t_int *w)

{
  t_sample *ptVar1;
  long lVar2;
  t_int tVar3;
  t_int tVar4;
  int iVar5;
  t_sample *dum_in;
  t_sample *dum_out;
  int n;
  int i;
  int parent;
  int up;
  t_sample *out;
  t_sample *in;
  t_int *w_local;
  
  ptVar1 = (t_sample *)w[1];
  lVar2 = w[2];
  tVar3 = w[3];
  tVar4 = w[4];
  dum_out._4_4_ = (int)tVar3;
  while (iVar5 = dum_out._4_4_ + -1, dum_out._4_4_ != 0) {
    _parent = (t_sample *)(lVar2 + (long)iVar5 * 4);
    dum_out._0_4_ = (int)tVar4;
    out = ptVar1;
    while (dum_out._4_4_ = iVar5, (int)dum_out != 0) {
      *_parent = *out;
      _parent = _parent + (int)tVar3;
      dum_out._0_4_ = (int)dum_out + -1;
      out = out + 1;
    }
  }
  return w + 5;
}

Assistant:

t_int *upsampling_perform_hold(t_int *w)
{
  t_sample *in  = (t_sample *)(w[1]); /* original signal     */
  t_sample *out = (t_sample *)(w[2]); /* upsampled signal    */
  int up       = (int)(w[3]);       /* upsampling factor   */
  int parent   = (int)(w[4]);       /* original vectorsize */
  int i=up;

  int n=parent;
  t_sample *dum_out = out;
  t_sample *dum_in  = in;

  while (i--) {
    n = parent;
    out = dum_out+i;
    in  = dum_in;
    while(n--){
      *out=*in++;
      out+=up;
    }
  }
  return (w+5);
}